

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall
pbrt::RealisticCamera::RenderExitPupil(RealisticCamera *this,Float sx,Float sy,char *filename)

{
  float fVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  Vector3f d;
  Point3<float> p;
  Allocator alloc;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  float fVar2;
  Float FVar3;
  Float FVar4;
  undefined8 uVar6;
  undefined1 auVar5 [64];
  Vector3<float> VVar7;
  Point3f pRear;
  Float lx;
  Float fx;
  int x;
  Float ly;
  Float fy;
  int y;
  Image image;
  int nSamples;
  Point3f pFilm;
  ImageMetadata *in_stack_00000730;
  string *in_stack_00000738;
  Image *in_stack_00000740;
  nullptr_t in_stack_fffffffffffffb08;
  nullptr_t pvVar8;
  int x_00;
  ImageMetadata *in_stack_fffffffffffffb10;
  iterator in_stack_fffffffffffffb18;
  size_type in_stack_fffffffffffffb20;
  float in_stack_fffffffffffffb2c;
  undefined8 in_stack_fffffffffffffb30;
  float in_stack_fffffffffffffb38;
  allocator<char> *in_stack_fffffffffffffb40;
  undefined1 auVar9 [16];
  undefined1 in_stack_fffffffffffffb48 [64];
  Image *in_stack_fffffffffffffb88;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  PixelFormat in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffc60;
  string *local_390;
  optional<float> local_370;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_368;
  undefined4 local_328;
  undefined1 local_324 [60];
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>
  in_stack_fffffffffffffd20;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_2cc;
  undefined4 local_2c4;
  optional<int> local_2c0;
  optional<float> local_2b8;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  allocator<char> local_239;
  string local_238 [48];
  undefined8 local_208;
  float local_200;
  undefined8 local_1f8;
  undefined4 local_1f0;
  undefined8 local_1e0;
  float local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_1a0;
  undefined4 local_198;
  Float local_150;
  float local_14c;
  int local_148;
  Float local_144;
  float local_140;
  int local_13c;
  nullptr_t local_138;
  undefined1 local_125;
  allocator<char> local_111;
  string *local_110;
  string local_108 [32];
  string *local_e8;
  undefined8 local_e0;
  undefined4 local_28;
  undefined8 local_24;
  undefined4 local_1c;
  
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffb10,
             (float)((ulong)in_stack_fffffffffffffb08 >> 0x20),SUB84(in_stack_fffffffffffffb08,0),
             0.0);
  local_28 = 0x800;
  Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffb10,
                      (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),(int)in_stack_fffffffffffffb08
                     );
  local_125 = 1;
  local_110 = local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb48._8_8_,in_stack_fffffffffffffb48._0_8_,
             in_stack_fffffffffffffb40);
  local_125 = 0;
  local_e8 = local_108;
  local_e0 = 1;
  v._M_len = in_stack_fffffffffffffb20;
  v._M_array = in_stack_fffffffffffffb18;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffffb10,v);
  ColorEncoding::TaggedPointer((ColorEncoding *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08)
  ;
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffb10);
  channels.ptr._4_4_ = in_stack_fffffffffffffc54;
  channels.ptr._0_4_ = in_stack_fffffffffffffc50;
  channels.n._0_4_ = in_stack_fffffffffffffc58;
  channels.n._4_4_ = in_stack_fffffffffffffc5c;
  alloc.memoryResource._4_4_ = in_stack_fffffffffffffc4c;
  alloc.memoryResource._0_4_ = in_stack_fffffffffffffc48;
  Image::Image((Image *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               in_stack_fffffffffffffc3c,(Point2i)in_stack_fffffffffffffc60,channels,
               (ColorEncoding *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),alloc)
  ;
  local_390 = (string *)&local_e8;
  pvVar8 = local_138;
  do {
    local_390 = local_390 + -0x20;
    std::__cxx11::string::~string(local_390);
  } while (local_390 != local_108);
  std::allocator<char>::~allocator(&local_111);
  for (local_13c = 0; auVar9 = in_stack_fffffffffffffb48._0_16_, local_13c < 0x800;
      local_13c = local_13c + 1) {
    fVar2 = (float)local_13c / 2047.0;
    local_140 = fVar2;
    FVar3 = RearElementRadius((RealisticCamera *)0x72c99b);
    FVar3 = -FVar3;
    FVar4 = RearElementRadius((RealisticCamera *)0x72c9d2);
    local_144 = Lerp(fVar2,FVar3,FVar4);
    for (local_148 = 0; local_148 < 0x800; local_148 = local_148 + 1) {
      fVar2 = (float)local_148 / 2047.0;
      local_14c = fVar2;
      FVar3 = RearElementRadius((RealisticCamera *)0x72ca73);
      FVar3 = -FVar3;
      FVar4 = RearElementRadius((RealisticCamera *)0x72caaa);
      local_150 = Lerp(fVar2,FVar3,FVar4);
      LensRearZ((RealisticCamera *)0x72cb23);
      Point3<float>::Point3
                ((Point3<float> *)in_stack_fffffffffffffb10,(float)((ulong)pvVar8 >> 0x20),
                 SUB84(pvVar8,0),0.0);
      fVar2 = local_150 * local_150;
      fVar1 = local_144 * local_144;
      FVar3 = RearElementRadius((RealisticCamera *)0x72cb8c);
      FVar4 = RearElementRadius((RealisticCamera *)0x72cba4);
      if (fVar2 + fVar1 <= FVar3 * FVar4) {
        local_198 = local_1c;
        local_1a0 = local_24;
        local_1b8 = local_1c;
        local_1c0 = local_24;
        local_1c8 = local_1c;
        local_1d0 = local_24;
        uVar6 = 0;
        p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffb38;
        p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffb30;
        p.super_Tuple3<pbrt::Point3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffffb30 >> 0x20);
        VVar7 = Point3<float>::operator-((Point3<float> *)in_stack_fffffffffffffb18,p);
        local_1d8 = VVar7.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar9._8_8_ = uVar6;
        auVar9._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_1e0 = vmovlpd_avx(auVar9);
        local_1b0 = local_1e0;
        local_1a8 = local_1d8;
        Medium::TaggedPointer((Medium *)in_stack_fffffffffffffb10,pvVar8);
        local_1f0 = local_198;
        local_1f8 = local_1a0;
        local_200 = local_1a8;
        local_208 = local_1b0;
        d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffb30;
        d.super_Tuple3<pbrt::Vector3,_float>.z =
             (float)(int)((ulong)in_stack_fffffffffffffb30 >> 0x20);
        d.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffb2c;
        Ray::Ray((Ray *)in_stack_fffffffffffffb10,(Point3f)in_stack_fffffffffffffb48._0_12_,d,
                 (Float)((ulong)pvVar8 >> 0x20),(Medium *)0x72ce80);
        FVar3 = TraceLensesFromFilm((RealisticCamera *)in_stack_fffffffffffffd20._8_8_,
                                    (Ray *)in_stack_fffffffffffffd20._0_8_,
                                    (Ray *)CONCAT44(in_stack_fffffffffffffd1c,
                                                    in_stack_fffffffffffffd18));
        x_00 = (int)((ulong)pvVar8 >> 0x20);
        if ((FVar3 != 0.0) || (NAN(FVar3))) {
          Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffb10,x_00,(int)pvVar8);
          Image::SetChannel(in_stack_fffffffffffffb88,(Point2i)in_stack_fffffffffffffb90,
                            in_stack_fffffffffffffb48._60_4_,in_stack_fffffffffffffb48._56_4_);
        }
        else {
          Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffb10,x_00,(int)pvVar8);
          Image::SetChannel(in_stack_fffffffffffffb88,(Point2i)in_stack_fffffffffffffb90,
                            in_stack_fffffffffffffb48._60_4_,in_stack_fffffffffffffb48._56_4_);
        }
      }
      else {
        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffb10,(int)((ulong)pvVar8 >> 0x20),
                            (int)pvVar8);
        Image::SetChannel(in_stack_fffffffffffffb88,(Point2i)in_stack_fffffffffffffb90,
                          in_stack_fffffffffffffb48._60_4_,in_stack_fffffffffffffb48._56_4_);
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (auVar9._8_8_,auVar9._0_8_,in_stack_fffffffffffffb40);
  local_370.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_370.set = false;
  local_370._5_3_ = 0;
  pstd::optional<float>::optional(&local_370);
  auVar5 = ZEXT1664((undefined1  [16])0x0);
  local_368 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(auVar5);
  local_328 = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_368.__align);
  auVar5 = vmovdqu64_avx512f(auVar5);
  local_324 = auVar5._0_60_;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&stack0xfffffffffffffcdc);
  pstd::optional<pbrt::Bounds2<int>_>::optional
            ((optional<pbrt::Bounds2<int>_> *)&stack0xfffffffffffffd20);
  local_2c4 = 0;
  local_2cc = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
  pstd::optional<pbrt::Point2<int>_>::optional((optional<pbrt::Point2<int>_> *)&local_2cc.__align);
  local_2c0.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_2c0.set = false;
  local_2c0._5_3_ = 0;
  pstd::optional<int>::optional(&local_2c0);
  local_2b8.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_2b8.set = false;
  local_2b8._5_3_ = 0;
  pstd::optional<float>::optional(&local_2b8);
  local_2b0 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
               )0x0;
  uStack_2a8 = 0;
  pstd::optional<const_pbrt::RGBColorSpace_*>::optional
            ((optional<const_pbrt::RGBColorSpace_*> *)&local_2b0.__align);
  uStack_280 = 0;
  uStack_278 = 0;
  local_2a0 = 0;
  uStack_298 = 0;
  uStack_290 = 0;
  uStack_288 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x72d102);
  uStack_250 = 0;
  uStack_248 = 0;
  local_270 = 0;
  uStack_268 = 0;
  uStack_260 = 0;
  uStack_258 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x72d12d);
  Image::Write(in_stack_00000740,in_stack_00000738,in_stack_00000730);
  ImageMetadata::~ImageMetadata(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  Image::~Image((Image *)in_stack_fffffffffffffb10);
  return;
}

Assistant:

void RealisticCamera::RenderExitPupil(Float sx, Float sy, const char *filename) const {
    Point3f pFilm(sx, sy, 0);

    const int nSamples = 2048;
    Image image(PixelFormat::Float, {nSamples, nSamples}, {"Y"});

    for (int y = 0; y < nSamples; ++y) {
        Float fy = (Float)y / (Float)(nSamples - 1);
        Float ly = Lerp(fy, -RearElementRadius(), RearElementRadius());
        for (int x = 0; x < nSamples; ++x) {
            Float fx = (Float)x / (Float)(nSamples - 1);
            Float lx = Lerp(fx, -RearElementRadius(), RearElementRadius());

            Point3f pRear(lx, ly, LensRearZ());

            if (lx * lx + ly * ly > RearElementRadius() * RearElementRadius())
                image.SetChannel({x, y}, 0, 1.);
            else if (TraceLensesFromFilm(Ray(pFilm, pRear - pFilm), nullptr))
                image.SetChannel({x, y}, 0, 0.5);
            else
                image.SetChannel({x, y}, 0, 0.);
        }
    }

    image.Write(filename);
}